

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O2

void __thiscall
clip_model_loader::clip_model_loader(clip_model_loader *this,char *fname,clip_ctx *ctx_clip)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  clip_model_loader *pcVar4;
  uint uVar5;
  uint uVar6;
  undefined4 uVar7;
  pointer __p;
  pointer __p_00;
  undefined8 uVar8;
  undefined8 uVar9;
  long lVar10;
  long lVar11;
  undefined8 uVar12;
  runtime_error *this_00;
  ulong uVar13;
  ulong uVar14;
  gguf_context_ptr *this_01;
  allocator<char> local_d9;
  string *local_d8;
  gguf_context_ptr *local_d0;
  clip_model_loader *local_c8;
  ggml_context *meta;
  string name;
  string description;
  string local_50;
  
  this_01 = &this->ctx_gguf;
  (this->ctx_meta)._M_t.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
  super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
  super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl = (ggml_context *)0x0;
  (this->ctx_gguf)._M_t.super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
  super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
  super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl = (gguf_context *)0x0;
  this->ctx_clip = ctx_clip;
  local_c8 = this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->fname,fname,(allocator<char> *)&name);
  meta = (ggml_context *)0x0;
  __p_00 = (pointer)gguf_init_from_file(fname,1);
  name._M_dataplus._M_p = (pointer)0x0;
  std::__uniq_ptr_impl<gguf_context,_gguf_context_deleter>::reset
            ((__uniq_ptr_impl<gguf_context,_gguf_context_deleter> *)this_01,__p_00);
  std::unique_ptr<gguf_context,_gguf_context_deleter>::~unique_ptr
            ((unique_ptr<gguf_context,_gguf_context_deleter> *)&name);
  pcVar4 = local_c8;
  local_d0 = this_01;
  if ((this_01->_M_t).super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
      super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
      super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl != (gguf_context *)0x0) {
    std::__uniq_ptr_impl<ggml_context,_ggml_context_deleter>::reset
              ((__uniq_ptr_impl<ggml_context,_ggml_context_deleter> *)local_c8,meta);
    uVar5 = gguf_get_n_tensors((pcVar4->ctx_gguf)._M_t.
                               super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
                               super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
                               super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl);
    name._M_dataplus._M_p = (pointer)&name.field_2;
    name._M_string_length = 0;
    name.field_2._M_local_buf[0] = '\0';
    local_d8 = &this->fname;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&description,"general.name",(allocator<char> *)&local_50);
    get_string(local_c8,&description,&name,false);
    std::__cxx11::string::~string((string *)&description);
    description._M_dataplus._M_p = (pointer)&description.field_2;
    description._M_string_length = 0;
    description.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"general.description",&local_d9);
    get_string(local_c8,&local_50,&description,false);
    std::__cxx11::string::~string((string *)&local_50);
    if ((int)g_logger_state.verbosity_thold < 3) {
      clip_log_internal(GGML_LOG_LEVEL_INFO,"%s: model name:   %s\n","clip_model_loader",
                        name._M_dataplus._M_p);
      if ((int)g_logger_state.verbosity_thold < 3) {
        clip_log_internal(GGML_LOG_LEVEL_INFO,"%s: description:  %s\n","clip_model_loader",
                          description._M_dataplus._M_p);
        if ((int)g_logger_state.verbosity_thold < 3) {
          uVar6 = gguf_get_version((this_01->_M_t).
                                   super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
                                   super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
                                   super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl);
          clip_log_internal(GGML_LOG_LEVEL_INFO,"%s: GGUF version: %d\n","clip_model_loader",
                            (ulong)uVar6);
          if ((int)g_logger_state.verbosity_thold < 3) {
            uVar8 = gguf_get_alignment((this_01->_M_t).
                                       super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>.
                                       _M_t.
                                       super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
                                       super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl);
            clip_log_internal(GGML_LOG_LEVEL_INFO,"%s: alignment:    %zu\n","clip_model_loader",
                              uVar8);
            if ((int)g_logger_state.verbosity_thold < 3) {
              clip_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_tensors:    %d\n","clip_model_loader",
                                (ulong)uVar5);
              if ((int)g_logger_state.verbosity_thold < 3) {
                uVar6 = gguf_get_n_kv((this_01->_M_t).
                                      super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t
                                      .super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
                                      super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl);
                clip_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_kv:         %d\n","clip_model_loader",
                                  (ulong)uVar6);
                if ((int)g_logger_state.verbosity_thold < 3) {
                  clip_log_internal(GGML_LOG_LEVEL_INFO,"\n");
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&description);
    std::__cxx11::string::~string((string *)&name);
    uVar13 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      uVar13 = 0;
    }
    for (uVar14 = 0; uVar13 != uVar14; uVar14 = uVar14 + 1) {
      uVar8 = gguf_get_tensor_name
                        ((this_01->_M_t).super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>.
                         _M_t.super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
                         super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl,uVar14);
      uVar9 = gguf_get_tensor_offset
                        ((this_01->_M_t).super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>.
                         _M_t.super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
                         super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl,uVar14);
      uVar7 = gguf_get_tensor_type
                        ((this_01->_M_t).super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>.
                         _M_t.super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
                         super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl,uVar14);
      lVar10 = ggml_get_tensor(meta,uVar8);
      lVar11 = ggml_nbytes(lVar10);
      local_c8->model_size = local_c8->model_size + lVar11;
      if ((int)g_logger_state.verbosity_thold < 2) {
        uVar5 = ggml_n_dims(lVar10);
        uVar8 = *(undefined8 *)(lVar10 + 0x10);
        uVar1 = *(undefined8 *)(lVar10 + 0x18);
        uVar2 = *(undefined8 *)(lVar10 + 0x20);
        uVar3 = *(undefined8 *)(lVar10 + 0x28);
        uVar12 = ggml_type_name(uVar7);
        clip_log_internal(GGML_LOG_LEVEL_DEBUG,
                          "%s: tensor[%d]: n_dims = %d, name = %s, tensor_size=%zu, offset=%zu, shape:[%lu, %lu, %lu, %lu], type = %s\n"
                          ,"clip_model_loader",uVar14 & 0xffffffff,(ulong)uVar5,lVar10 + 0x100,
                          lVar11,uVar9,uVar8,uVar1,uVar2,uVar3,uVar12);
      }
      this_01 = local_d0;
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  string_format_abi_cxx11_
            (&name,"%s: failed to load CLIP model from %s. Does this file exist?\n",
             "clip_model_loader",fname);
  std::runtime_error::runtime_error(this_00,(string *)&name);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

clip_model_loader(const char * fname, clip_ctx & ctx_clip) : ctx_clip(ctx_clip), fname(fname) {
        struct ggml_context * meta = nullptr;

        struct gguf_init_params params = {
            /*.no_alloc = */ true,
            /*.ctx      = */ &meta,
        };

        ctx_gguf = gguf_context_ptr(gguf_init_from_file(fname, params));
        if (!ctx_gguf.get()) {
            throw std::runtime_error(string_format("%s: failed to load CLIP model from %s. Does this file exist?\n", __func__, fname));
        }

        ctx_meta.reset(meta);

        const int n_tensors = gguf_get_n_tensors(ctx_gguf.get());

        // print gguf info
        {
            std::string name;
            get_string(KEY_NAME, name, false);
            std::string description;
            get_string(KEY_DESCRIPTION, description, false);
            LOG_INF("%s: model name:   %s\n",  __func__, name.c_str());
            LOG_INF("%s: description:  %s\n",  __func__, description.c_str());
            LOG_INF("%s: GGUF version: %d\n",  __func__, gguf_get_version(ctx_gguf.get()));
            LOG_INF("%s: alignment:    %zu\n", __func__, gguf_get_alignment(ctx_gguf.get()));
            LOG_INF("%s: n_tensors:    %d\n",  __func__, n_tensors);
            LOG_INF("%s: n_kv:         %d\n",  __func__, (int)gguf_get_n_kv(ctx_gguf.get()));
            LOG_INF("\n");
        }

        // tensors
        {
            for (int i = 0; i < n_tensors; ++i) {
                const char * name = gguf_get_tensor_name(ctx_gguf.get(), i);
                const size_t offset = gguf_get_tensor_offset(ctx_gguf.get(), i);
                enum ggml_type type = gguf_get_tensor_type(ctx_gguf.get(), i);
                struct ggml_tensor * cur = ggml_get_tensor(meta, name);
                size_t tensor_size = ggml_nbytes(cur);
                model_size += tensor_size;
                LOG_DBG("%s: tensor[%d]: n_dims = %d, name = %s, tensor_size=%zu, offset=%zu, shape:[%" PRIu64 ", %" PRIu64 ", %" PRIu64 ", %" PRIu64 "], type = %s\n",
                    __func__, i, ggml_n_dims(cur), cur->name, tensor_size, offset, cur->ne[0], cur->ne[1], cur->ne[2], cur->ne[3], ggml_type_name(type));
            }
        }
    }